

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# behaviour_dictionary.c
# Opt level: O1

void test_bhdct_get_all_string_key(planck_unit_test_t *tc)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  char key [9];
  ion_dictionary_t dict;
  ion_dictionary_handler_t handler;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  char local_a8 [16];
  ion_dictionary_t local_98;
  ion_dictionary_handler_t local_80;
  
  local_a8[8] = 0;
  local_a8[0] = '\0';
  local_a8[1] = '\0';
  local_a8[2] = '\0';
  local_a8[3] = '\0';
  local_a8[4] = '\0';
  local_a8[5] = '\0';
  local_a8[6] = '\0';
  local_a8[7] = '\0';
  bhdct_setup_string_key(tc,&local_80,&local_98,ion_fill_edge_cases);
  iVar3 = 0;
  uVar2 = 0;
  do {
    sprintf(local_a8,"k%d",uVar2);
    local_ac = iVar3;
    bhdct_get(tc,&local_98,local_a8,&local_ac,'\0',1);
    uVar1 = (int)uVar2 + 1;
    uVar2 = (ulong)uVar1;
    iVar3 = iVar3 + 2;
  } while (uVar1 != 10);
  uVar1 = 0x30;
  iVar3 = 0xfa;
  do {
    uVar1 = uVar1 + 2;
    sprintf(local_a8,"k%d",(ulong)uVar1);
    local_b0 = iVar3;
    bhdct_get(tc,&local_98,local_a8,&local_b0,'\0',1);
    iVar3 = iVar3 + 10;
  } while (uVar1 < 0x62);
  uVar1 = 0x1ef;
  iVar3 = 5000;
  do {
    uVar1 = uVar1 + 5;
    sprintf(local_a8,"k%d",(ulong)uVar1);
    local_b4 = iVar3;
    bhdct_get(tc,&local_98,local_a8,&local_b4,'\0',1);
    iVar3 = iVar3 + 0x32;
  } while (uVar1 < 0x3e3);
  uVar1 = 0xffffff9a;
  iVar3 = -300;
  do {
    uVar1 = uVar1 + 2;
    sprintf(local_a8,"k%d",(ulong)uVar1);
    local_b8 = iVar3;
    bhdct_get(tc,&local_98,local_a8,&local_b8,'\0',1);
    iVar3 = iVar3 + 6;
  } while ((int)uVar1 < -0x34);
  bhdct_delete_dictionary(tc,&local_98);
  bhdct_close_master_table(tc);
  bhdct_delete_master_table(tc);
  return;
}

Assistant:

void
test_bhdct_get_all_string_key(
	planck_unit_test_t *tc
) {
	ion_dictionary_handler_t	handler;
	ion_dictionary_t			dict;
	char						key[ION_BHDCT_STRING_KEY_BUFFER_SIZE] = { 0 };

	bhdct_setup_string_key(tc, &handler, &dict, ion_fill_edge_cases);

	int i;

	ION_FILL_LOW_LOOP(i) {
		sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, i);
		bhdct_get(tc, &dict, key, ION_LOW_VALUE(i), err_ok, 1);
	}
	ION_FILL_MEDIUM_LOOP(i) {
		sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, i);
		bhdct_get(tc, &dict, key, ION_MEDIUM_VALUE(i), err_ok, 1);
	}
	ION_FILL_HIGH_LOOP(i) {
		sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, i);
		bhdct_get(tc, &dict, key, ION_HIGH_VALUE(i), err_ok, 1);
	}
	ION_FILL_EDGE_LOOP(i) {
		sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, i);
		bhdct_get(tc, &dict, key, ION_EDGE_VALUE(i), err_ok, 1);
	}

	bhdct_takedown(tc, &dict);
}